

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_group.c
# Opt level: O0

ucs4_t ** dictionary_group_match_longest
                    (dictionary_group_t t_dictionary,ucs4_t *word,size_t maxlen,size_t *match_length
                    )

{
  ucs4_t **ppuVar1;
  ucs4_t **t_retval;
  size_t i;
  size_t max_length;
  size_t t_match_length;
  ucs4_t **retval;
  dictionary_group_desc *dictionary_group;
  size_t *match_length_local;
  size_t maxlen_local;
  ucs4_t *word_local;
  dictionary_group_t t_dictionary_local;
  
  if (*t_dictionary == 0) {
    errnum = DICTIONARY_ERROR_NODICT;
    t_dictionary_local = (dictionary_group_t)0xffffffffffffffff;
  }
  else {
    t_match_length = 0;
    i = 0;
    retval = (ucs4_t **)t_dictionary;
    dictionary_group = (dictionary_group_desc *)match_length;
    match_length_local = (size_t *)maxlen;
    maxlen_local = (size_t)word;
    word_local = (ucs4_t *)t_dictionary;
    for (t_retval = (ucs4_t **)0x0; t_retval < *retval; t_retval = (ucs4_t **)((long)t_retval + 1))
    {
      ppuVar1 = dictionary_match_longest
                          (retval[(long)t_retval + 1],(ucs4_t *)maxlen_local,
                           (size_t)match_length_local,&max_length);
      if ((ppuVar1 != (ucs4_t **)0x0) && (i < max_length)) {
        i = max_length;
        t_match_length = (size_t)ppuVar1;
      }
    }
    if (dictionary_group != (dictionary_group_desc *)0x0) {
      dictionary_group->count = i;
    }
    t_dictionary_local = (dictionary_group_t)t_match_length;
  }
  return (ucs4_t **)t_dictionary_local;
}

Assistant:

const ucs4_t * const * dictionary_group_match_longest(dictionary_group_t t_dictionary, const ucs4_t * word,
		size_t maxlen, size_t * match_length)
{
	dictionary_group_desc * dictionary_group = (dictionary_group_desc *) t_dictionary;

	if (dictionary_group->count == 0)
	{
		errnum = DICTIONARY_ERROR_NODICT;
		return (const ucs4_t * const *) -1;
	}

	const ucs4_t * const * retval = NULL;
	size_t t_match_length, max_length = 0;

	size_t i;
	for (i = 0; i < dictionary_group->count; i ++)
	{
		/* 依次查找每個辭典，取得最長匹配長度 */
		const ucs4_t * const * t_retval = dictionary_match_longest(
				dictionary_group->dicts[i],
				word,
				maxlen,
				&t_match_length
		);

		if (t_retval != NULL)
		{
			if (t_match_length > max_length)
			{
				max_length = t_match_length;
				retval = t_retval;
			}
		}
	}

	if (match_length != NULL)
	{
		*match_length = max_length;
	}

	return retval;
}